

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O2

void __thiscall
CRenderTools::RenderQuads
          (CRenderTools *this,CQuad *pQuads,int NumQuads,int RenderFlags,ENVELOPE_EVAL pfnEval,
          void *pUser)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  vec2 vVar4;
  byte bVar5;
  int k;
  long lVar6;
  byte bVar7;
  CPoint *pCVar8;
  ulong uVar9;
  ulong uVar10;
  CPoint *pCVar11;
  long in_FS_OFFSET;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_120;
  float local_f8;
  float fStack_f4;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float aChannels [4];
  vec2 aTexCoords [4];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  uVar9 = 0;
  uVar10 = (ulong)(uint)NumQuads;
  if (NumQuads < 1) {
    uVar10 = uVar9;
  }
  pCVar11 = pQuads->m_aTexcoords;
  while( true ) {
    if (uVar9 == uVar10) break;
    pCVar8 = pQuads[uVar9].m_aPoints;
    fVar12 = 1.0;
    fVar13 = 1.0;
    fVar15 = 1.0;
    fVar16 = 1.0;
    if (-1 < pQuads[uVar9].m_ColorEnv) {
      (*pfnEval)((float)((CQuad *)pCVar8)->m_ColorEnvOffset / 1000.0,pQuads[uVar9].m_ColorEnv,
                 aChannels,pUser);
      fVar12 = aChannels[1];
      fVar13 = aChannels[2];
      fVar15 = aChannels[3];
      fVar16 = aChannels[0];
    }
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      vVar4.field_1.y = (float)pCVar11[lVar6].y * 0.0009765625;
      vVar4.field_0.x = (float)pCVar11[lVar6].x * 0.0009765625;
      aTexCoords[lVar6] = vVar4;
    }
    lVar6 = 0;
    bVar7 = 0;
    bVar5 = 0;
    while( true ) {
      if (lVar6 == 4) break;
      if (1.0 < aTexCoords[lVar6].field_0.x) {
        bVar7 = 1;
      }
      if (aTexCoords[lVar6].field_0.x < 0.0) {
        bVar7 = 1;
      }
      if (1.0 < aTexCoords[lVar6].field_1.y) {
        bVar5 = 1;
      }
      if (aTexCoords[lVar6].field_1.y < 0.0) {
        bVar5 = 1;
      }
      lVar6 = lVar6 + 1;
    }
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0xc])
              (this->m_pGraphics,(ulong)(byte)~bVar7 & 1,(ulong)(~bVar5 & 1),
               (ulong)(byte)~bVar7 & 0xffffffffffffff01);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1b])
              (aTexCoords[0].field_0.x,aTexCoords[0].field_1.y,(ulong)(uint)aTexCoords[1].field_0,
               aTexCoords[1].field_1.y,aTexCoords[2].field_0.x,aTexCoords[2].field_1.y,
               aTexCoords[3].field_0.x,aTexCoords[3].field_1.y,this->m_pGraphics,0xffffffffffffffff)
    ;
    if (((CQuad *)pCVar8)->m_PosEnv < 0) {
      local_f8 = 0.0;
      fStack_f4 = 0.0;
      local_120 = 0.0;
    }
    else {
      (*pfnEval)((float)((CQuad *)pCVar8)->m_PosEnvOffset / 1000.0,((CQuad *)pCVar8)->m_PosEnv,
                 aChannels,pUser);
      local_f8 = aChannels[0];
      fStack_f4 = aChannels[1];
      local_120 = (aChannels[2] / 360.0) * 3.1415927;
      local_120 = local_120 + local_120;
    }
    fVar14 = (float)((CQuad *)pCVar8)->m_aColors[0].a;
    uVar1 = ((CQuad *)pCVar8)->m_aColors[0].g;
    uVar2 = ((CQuad *)pCVar8)->m_aColors[0].b;
    aChannels[0] = 0.0;
    aChannels[1] = (float)((CQuad *)pCVar8)->m_aColors[0].r * 0.003921569 * fVar16 * fVar14 *
                   0.003921569 * fVar15;
    aChannels[2] = fVar14 * (float)(int)uVar1 * 0.003921569 * fVar12 * 0.003921569 * fVar15;
    aChannels[3] = fVar14 * (float)(int)uVar2 * 0.003921569 * fVar13 * 0.003921569 * fVar15;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,aChannels,4);
    if ((local_120 != 0.0) || (NAN(local_120))) {
      RenderQuads::aRotated[0] = ((CQuad *)pCVar8)->m_aPoints[0];
      RenderQuads::aRotated[1] = ((CQuad *)pCVar8)->m_aPoints[1];
      RenderQuads::aRotated[2] = ((CQuad *)pCVar8)->m_aPoints[2];
      RenderQuads::aRotated[3] = ((CQuad *)pCVar8)->m_aPoints[3];
      pCVar8 = ((CQuad *)pCVar8)->m_aPoints + 4;
      Rotate(pCVar8,RenderQuads::aRotated,local_120);
      Rotate(pCVar8,RenderQuads::aRotated + 1,local_120);
      Rotate(pCVar8,RenderQuads::aRotated + 2,local_120);
      Rotate(pCVar8,RenderQuads::aRotated + 3,local_120);
      pCVar8 = RenderQuads::aRotated;
    }
    local_c8 = (float)((CQuad *)pCVar8)->m_aPoints[0].x * 0.0009765625 + local_f8;
    fStack_c4 = (float)((CQuad *)pCVar8)->m_aPoints[0].y * 0.0009765625 + fStack_f4;
    fStack_c0 = (float)((CQuad *)pCVar8)->m_aPoints[1].x * 0.0009765625 + local_f8;
    fStack_bc = (float)((CQuad *)pCVar8)->m_aPoints[1].y * 0.0009765625 + fStack_f4;
    local_b8 = (float)((CQuad *)pCVar8)->m_aPoints[2].x * 0.0009765625 + local_f8;
    fStack_b4 = (float)((CQuad *)pCVar8)->m_aPoints[2].y * 0.0009765625 + fStack_f4;
    fStack_b0 = (float)((CQuad *)pCVar8)->m_aPoints[3].x * 0.0009765625 + local_f8;
    fStack_ac = (float)((CQuad *)pCVar8)->m_aPoints[3].y * 0.0009765625 + fStack_f4;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1e])(this->m_pGraphics,&local_c8,1);
    uVar9 = uVar9 + 1;
    pCVar11 = pCVar11 + 0x13;
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[10])();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRenderTools::RenderQuads(const CQuad *pQuads, int NumQuads, int RenderFlags, ENVELOPE_EVAL pfnEval, void *pUser)
{
	Graphics()->QuadsBegin();
	float Conv = 1/255.0f;
	for(int i = 0; i < NumQuads; i++)
	{
		const CQuad *q = &pQuads[i];

		float r=1, g=1, b=1, a=1;

		if(q->m_ColorEnv >= 0)
		{
			float aChannels[4];
			pfnEval(q->m_ColorEnvOffset/1000.0f, q->m_ColorEnv, aChannels, pUser);
			r = aChannels[0];
			g = aChannels[1];
			b = aChannels[2];
			a = aChannels[3];
		}

		/*bool Opaque = false;
		 TODO: Analyze quadtexture
		if(a < 0.01f || (q->m_aColors[0].a < 0.01f && q->m_aColors[1].a < 0.01f && q->m_aColors[2].a < 0.01f && q->m_aColors[3].a < 0.01f))
			Opaque = true;

		if(Opaque && !(RenderFlags&LAYERRENDERFLAG_OPAQUE))
			continue;
		if(!Opaque && !(RenderFlags&LAYERRENDERFLAG_TRANSPARENT))
			continue;
		*/
		vec2 aTexCoords[4];
		for(int k = 0; k < 4; k++)
		{
			aTexCoords[k].x = fx2f(q->m_aTexcoords[k].x);
			aTexCoords[k].y = fx2f(q->m_aTexcoords[k].y);
		}

		// Check if we want to repeat the texture
		// Otherwise clamp to the edge to prevent texture bleeding
		bool RepeatU = false, RepeatV = false;
		for(int k = 0; k < 4; k++)
		{
			if(aTexCoords[k].x < 0.0f || aTexCoords[k].x > 1.0f)
				RepeatU = true;
			if(aTexCoords[k].y < 0.0f || aTexCoords[k].y > 1.0f)
				RepeatV = true;
		}
		Graphics()->WrapMode(
			RepeatU ? IGraphics::WRAP_REPEAT : IGraphics::WRAP_CLAMP,
			RepeatV ? IGraphics::WRAP_REPEAT : IGraphics::WRAP_CLAMP);

		Graphics()->QuadsSetSubsetFree(
			aTexCoords[0].x, aTexCoords[0].y,
			aTexCoords[1].x, aTexCoords[1].y,
			aTexCoords[2].x, aTexCoords[2].y,
			aTexCoords[3].x, aTexCoords[3].y);

		float OffsetX = 0;
		float OffsetY = 0;
		float Rot = 0;

		// TODO: fix this
		if(q->m_PosEnv >= 0)
		{
			float aChannels[4];
			pfnEval(q->m_PosEnvOffset/1000.0f, q->m_PosEnv, aChannels, pUser);
			OffsetX = aChannels[0];
			OffsetY = aChannels[1];
			Rot = aChannels[2]/360.0f*pi*2;
		}

		IGraphics::CColorVertex Array[4] = {
			IGraphics::CColorVertex(0, q->m_aColors[0].r*Conv*r*q->m_aColors[0].a*Conv*a, q->m_aColors[0].g*Conv*g*q->m_aColors[0].a*Conv*a, q->m_aColors[0].b*Conv*b*q->m_aColors[0].a*Conv*a, q->m_aColors[0].a*Conv*a),
			IGraphics::CColorVertex(1, q->m_aColors[1].r*Conv*r*q->m_aColors[1].a*Conv*a, q->m_aColors[1].g*Conv*g*q->m_aColors[1].a*Conv*a, q->m_aColors[1].b*Conv*b*q->m_aColors[1].a*Conv*a, q->m_aColors[1].a*Conv*a),
			IGraphics::CColorVertex(2, q->m_aColors[2].r*Conv*r*q->m_aColors[2].a*Conv*a, q->m_aColors[2].g*Conv*g*q->m_aColors[2].a*Conv*a, q->m_aColors[2].b*Conv*b*q->m_aColors[2].a*Conv*a, q->m_aColors[2].a*Conv*a),
			IGraphics::CColorVertex(3, q->m_aColors[3].r*Conv*r*q->m_aColors[3].a*Conv*a, q->m_aColors[3].g*Conv*g*q->m_aColors[3].a*Conv*a, q->m_aColors[3].b*Conv*b*q->m_aColors[3].a*Conv*a, q->m_aColors[3].a*Conv*a)};
		Graphics()->SetColorVertex(Array, 4);

		const CPoint *pPoints = q->m_aPoints;

		if(Rot != 0)
		{
			static CPoint aRotated[4];
			aRotated[0] = q->m_aPoints[0];
			aRotated[1] = q->m_aPoints[1];
			aRotated[2] = q->m_aPoints[2];
			aRotated[3] = q->m_aPoints[3];
			pPoints = aRotated;

			Rotate(&q->m_aPoints[4], &aRotated[0], Rot);
			Rotate(&q->m_aPoints[4], &aRotated[1], Rot);
			Rotate(&q->m_aPoints[4], &aRotated[2], Rot);
			Rotate(&q->m_aPoints[4], &aRotated[3], Rot);
		}

		IGraphics::CFreeformItem Freeform(
			fx2f(pPoints[0].x)+OffsetX, fx2f(pPoints[0].y)+OffsetY,
			fx2f(pPoints[1].x)+OffsetX, fx2f(pPoints[1].y)+OffsetY,
			fx2f(pPoints[2].x)+OffsetX, fx2f(pPoints[2].y)+OffsetY,
			fx2f(pPoints[3].x)+OffsetX, fx2f(pPoints[3].y)+OffsetY);
		Graphics()->QuadsDrawFreeform(&Freeform, 1);
	}
	Graphics()->QuadsEnd();
	Graphics()->WrapNormal();
}